

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeT2AddrModeSOReg(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  bool bVar1;
  uint uVar2;
  DecodeStatus DVar3;
  uint16_t *Decoder_00;
  uint64_t Address_00;
  uint uVar4;
  
  uVar4 = Val >> 6 & 0xf;
  uVar2 = MCInst_getOpcode(Inst);
  if (((0x15 < uVar2 - 0xa37) || ((0x204001U >> (uVar2 - 0xa37 & 0x1f) & 1) == 0)) || (uVar4 != 0xf)
     ) {
    Decoder_00 = GPRDecoderTable;
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar4]);
    DVar3 = DecoderGPRRegisterClass(Inst,Val >> 2 & 0xf,Address_00,Decoder_00);
    bVar1 = true;
    if ((DVar3 != MCDisassembler_Success) && (DVar3 != MCDisassembler_SoftFail)) {
      if (DVar3 != MCDisassembler_Fail) {
        DVar3 = MCDisassembler_Success;
      }
      bVar1 = false;
    }
    if (bVar1) {
      MCOperand_CreateImm0(Inst,(ulong)(Val & 3));
      return DVar3;
    }
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeT2AddrModeSOReg(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 6, 4);
	unsigned Rm = fieldFromInstruction_4(Val, 2, 4);
	unsigned imm = fieldFromInstruction_4(Val, 0, 2);

	// Thumb stores cannot use PC as dest register.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2STRHs:
		case ARM_t2STRBs:
		case ARM_t2STRs:
			if (Rn == 15)
				return MCDisassembler_Fail;
		default:
			break;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, imm);

	return S;
}